

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItemPrivate::setIsMemberOfGroup(QGraphicsItemPrivate *this,bool enabled)

{
  long lVar1;
  QGraphicsItem **ppQVar2;
  int iVar3;
  undefined7 in_register_00000031;
  long lVar4;
  
  *(ulong *)&this->field_0x160 =
       *(ulong *)&this->field_0x160 & 0xffffffffffffefff |
       (ulong)(uint)((int)CONCAT71(in_register_00000031,enabled) << 0xc);
  if ((this->q_ptr != (QGraphicsItem *)0x0) &&
     (iVar3 = (*this->q_ptr->_vptr_QGraphicsItem[0xb])(), iVar3 == 10)) {
    return;
  }
  lVar1 = (this->children).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->children).d.ptr;
    lVar4 = 0;
    do {
      setIsMemberOfGroup(*(QGraphicsItemPrivate **)(*(long *)((long)ppQVar2 + lVar4) + 8),enabled);
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setIsMemberOfGroup(bool enabled)
{
    Q_Q(QGraphicsItem);
    isMemberOfGroup = enabled;
    if (!qgraphicsitem_cast<QGraphicsItemGroup *>(q)) {
        for (QGraphicsItem *child : std::as_const(children))
            child->d_func()->setIsMemberOfGroup(enabled);
    }
}